

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

void MD5Transform(DWORD *buf,DWORD *in)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  DWORD DVar4;
  DWORD DVar5;
  DWORD DVar6;
  DWORD DVar7;
  DWORD DVar8;
  DWORD DVar9;
  DWORD DVar10;
  DWORD DVar11;
  DWORD DVar12;
  DWORD DVar13;
  DWORD DVar14;
  DWORD DVar15;
  DWORD DVar16;
  DWORD DVar17;
  DWORD DVar18;
  DWORD DVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  
  uVar1 = buf[1];
  uVar2 = buf[2];
  uVar3 = buf[3];
  DVar4 = *in;
  DVar5 = in[1];
  uVar20 = ((uVar3 ^ uVar2) & uVar1 ^ uVar3) + *buf + DVar4 + 0xd76aa478;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar1;
  uVar21 = ((uVar2 ^ uVar1) & uVar20 ^ uVar2) + uVar3 + DVar5 + 0xe8c7b756;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  DVar6 = in[2];
  uVar22 = ((uVar20 ^ uVar1) & uVar21 ^ uVar1) + DVar6 + uVar2 + 0x242070db;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  DVar7 = in[3];
  uVar24 = uVar1 + DVar7 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xc1bdceee;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  DVar8 = in[4];
  uVar20 = uVar20 + DVar8 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0xf57c0faf;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  DVar9 = in[5];
  uVar21 = uVar21 + DVar9 + ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + 0x4787c62a;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  DVar10 = in[6];
  uVar22 = uVar22 + DVar10 + ((uVar20 ^ uVar24) & uVar21 ^ uVar24) + 0xa8304613;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  DVar11 = in[7];
  uVar24 = uVar24 + DVar11 + ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + 0xfd469501;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  DVar12 = in[8];
  uVar20 = uVar20 + DVar12 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0x698098d8;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  DVar13 = in[9];
  uVar21 = uVar21 + DVar13 + ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + 0x8b44f7af;
  uVar21 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  DVar14 = in[10];
  uVar22 = (uVar22 + DVar14 + ((uVar20 ^ uVar24) & uVar21 ^ uVar24)) - 0xa44f;
  uVar22 = (uVar22 * 0x20000 | uVar22 >> 0xf) + uVar21;
  DVar15 = in[0xb];
  uVar24 = ((uVar21 ^ uVar20) & uVar22 ^ uVar20) + uVar24 + DVar15 + 0x895cd7be;
  uVar24 = (uVar24 * 0x400000 | uVar24 >> 10) + uVar22;
  DVar16 = in[0xc];
  uVar20 = uVar20 + DVar16 + ((uVar22 ^ uVar21) & uVar24 ^ uVar21) + 0x6b901122;
  uVar20 = (uVar20 * 0x80 | uVar20 >> 0x19) + uVar24;
  DVar17 = in[0xd];
  uVar21 = ((uVar24 ^ uVar22) & uVar20 ^ uVar22) + uVar21 + DVar17 + 0xfd987193;
  uVar23 = (uVar21 * 0x1000 | uVar21 >> 0x14) + uVar20;
  DVar18 = in[0xe];
  uVar21 = uVar22 + DVar18 + ((uVar20 ^ uVar24) & uVar23 ^ uVar24) + 0xa679438e;
  uVar22 = (uVar21 * 0x20000 | uVar21 >> 0xf) + uVar23;
  DVar19 = in[0xf];
  uVar21 = uVar24 + DVar19 + ((uVar23 ^ uVar20) & uVar22 ^ uVar20) + 0x49b40821;
  uVar24 = (uVar21 * 0x400000 | uVar21 >> 10) + uVar22;
  uVar20 = uVar20 + DVar5 + ((uVar24 ^ uVar22) & uVar23 ^ uVar22) + 0xf61e2562;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + uVar23 + DVar10 + 0xc040b340;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + DVar15 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0x265e5a51;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + DVar4 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0xe9b6c7aa;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + DVar9 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0xd62f105d;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + DVar14 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0x2441453;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + DVar19 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0xd8a1e681;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + DVar8 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0xe7d3fbc8;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + DVar13 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0x21e1cde6;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + DVar18 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0xc33707d6;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + DVar7 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0xf4d50d87;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + DVar12 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0x455a14ed;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = uVar20 + DVar17 + ((uVar24 ^ uVar22) & uVar21 ^ uVar22) + 0xa9e3e905;
  uVar20 = (uVar20 * 0x20 | uVar20 >> 0x1b) + uVar24;
  uVar21 = uVar21 + DVar6 + ((uVar20 ^ uVar24) & uVar22 ^ uVar24) + 0xfcefa3f8;
  uVar21 = (uVar21 * 0x200 | uVar21 >> 0x17) + uVar20;
  uVar22 = uVar22 + DVar11 + ((uVar21 ^ uVar20) & uVar24 ^ uVar20) + 0x676f02d9;
  uVar22 = (uVar22 * 0x4000 | uVar22 >> 0x12) + uVar21;
  uVar24 = uVar24 + DVar16 + ((uVar22 ^ uVar21) & uVar20 ^ uVar21) + 0x8d2a4c8a;
  uVar24 = (uVar24 * 0x100000 | uVar24 >> 0xc) + uVar22;
  uVar20 = (uVar20 + DVar9 + (uVar22 ^ uVar21 ^ uVar24)) - 0x5c6be;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + DVar12 + (uVar24 ^ uVar22 ^ uVar20) + 0x8771f681;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + DVar15 + (uVar20 ^ uVar24 ^ uVar21) + 0x6d9d6122;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = uVar24 + DVar18 + (uVar21 ^ uVar20 ^ uVar22) + 0xfde5380c;
  uVar24 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = uVar20 + DVar5 + (uVar22 ^ uVar21 ^ uVar24) + 0xa4beea44;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + DVar8 + (uVar24 ^ uVar22 ^ uVar20) + 0x4bdecfa9;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + DVar11 + (uVar20 ^ uVar24 ^ uVar21) + 0xf6bb4b60;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = uVar24 + DVar14 + (uVar21 ^ uVar20 ^ uVar22) + 0xbebfbc70;
  uVar24 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = uVar20 + DVar17 + (uVar22 ^ uVar21 ^ uVar24) + 0x289b7ec6;
  uVar20 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar24;
  uVar21 = uVar21 + DVar4 + (uVar24 ^ uVar22 ^ uVar20) + 0xeaa127fa;
  uVar21 = (uVar21 * 0x800 | uVar21 >> 0x15) + uVar20;
  uVar22 = uVar22 + DVar7 + (uVar20 ^ uVar24 ^ uVar21) + 0xd4ef3085;
  uVar22 = (uVar22 * 0x10000 | uVar22 >> 0x10) + uVar21;
  uVar24 = (uVar21 ^ uVar20 ^ uVar22) + uVar24 + DVar10 + 0x4881d05;
  uVar23 = (uVar24 * 0x800000 | uVar24 >> 9) + uVar22;
  uVar20 = (uVar22 ^ uVar21 ^ uVar23) + uVar20 + DVar13 + 0xd9d4d039;
  uVar24 = (uVar20 * 0x10 | uVar20 >> 0x1c) + uVar23;
  uVar20 = (uVar23 ^ uVar22 ^ uVar24) + uVar21 + DVar16 + 0xe6db99e5;
  uVar20 = (uVar20 * 0x800 | uVar20 >> 0x15) + uVar24;
  uVar21 = (uVar24 ^ uVar23 ^ uVar20) + uVar22 + DVar19 + 0x1fa27cf8;
  uVar21 = (uVar21 * 0x10000 | uVar21 >> 0x10) + uVar20;
  uVar22 = (uVar20 ^ uVar24 ^ uVar21) + uVar23 + DVar6 + 0xc4ac5665;
  uVar22 = (uVar22 * 0x800000 | uVar22 >> 9) + uVar21;
  uVar24 = ((~uVar20 | uVar22) ^ uVar21) + uVar24 + DVar4 + 0xf4292244;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar22;
  uVar20 = ((~uVar21 | uVar24) ^ uVar22) + uVar20 + DVar11 + 0x432aff97;
  uVar23 = (uVar20 * 0x400 | uVar20 >> 0x16) + uVar24;
  uVar20 = uVar21 + DVar18 + ((~uVar22 | uVar23) ^ uVar24) + 0xab9423a7;
  uVar21 = (uVar20 * 0x8000 | uVar20 >> 0x11) + uVar23;
  uVar20 = ((~uVar24 | uVar21) ^ uVar23) + uVar22 + DVar9 + 0xfc93a039;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = ((~uVar23 | uVar20) ^ uVar21) + uVar24 + DVar16 + 0x655b59c3;
  uVar22 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar24 = uVar23 + DVar7 + ((~uVar21 | uVar22) ^ uVar20) + 0x8f0ccc92;
  uVar23 = (uVar24 * 0x400 | uVar24 >> 0x16) + uVar22;
  uVar21 = (uVar21 + DVar14 + ((~uVar20 | uVar23) ^ uVar22)) - 0x100b83;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar23;
  uVar20 = uVar20 + DVar5 + ((~uVar22 | uVar21) ^ uVar23) + 0x85845dd1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar22 = uVar22 + DVar12 + ((~uVar23 | uVar20) ^ uVar21) + 0x6fa87e4f;
  uVar24 = (uVar22 * 0x40 | uVar22 >> 0x1a) + uVar20;
  uVar22 = ((~uVar21 | uVar24) ^ uVar20) + uVar23 + DVar19 + 0xfe2ce6e0;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar24;
  uVar21 = uVar21 + DVar10 + ((~uVar20 | uVar22) ^ uVar24) + 0xa3014314;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + DVar17 + ((~uVar24 | uVar21) ^ uVar22) + 0x4e0811a1;
  uVar20 = (uVar20 * 0x200000 | uVar20 >> 0xb) + uVar21;
  uVar24 = ((~uVar22 | uVar20) ^ uVar21) + uVar24 + DVar8 + 0xf7537e82;
  uVar24 = (uVar24 * 0x40 | uVar24 >> 0x1a) + uVar20;
  uVar22 = uVar22 + DVar15 + ((~uVar21 | uVar24) ^ uVar20) + 0xbd3af235;
  uVar22 = (uVar22 * 0x400 | uVar22 >> 0x16) + uVar24;
  uVar21 = uVar21 + DVar6 + ((~uVar20 | uVar22) ^ uVar24) + 0x2ad7d2bb;
  uVar21 = (uVar21 * 0x8000 | uVar21 >> 0x11) + uVar22;
  uVar20 = uVar20 + DVar13 + ((~uVar24 | uVar21) ^ uVar22) + 0xeb86d391;
  *buf = uVar24 + *buf;
  buf[1] = uVar1 + uVar21 + (uVar20 * 0x200000 | uVar20 >> 0xb);
  buf[2] = uVar21 + uVar2;
  buf[3] = uVar22 + uVar3;
  return;
}

Assistant:

void
MD5Transform(DWORD buf[4], const DWORD in[16])
{
	DWORD a, b, c, d;

	a = buf[0];
	b = buf[1];
	c = buf[2];
	d = buf[3];

	MD5STEP(F1, a, b, c, d, in[0] + 0xd76aa478, 7);
	MD5STEP(F1, d, a, b, c, in[1] + 0xe8c7b756, 12);
	MD5STEP(F1, c, d, a, b, in[2] + 0x242070db, 17);
	MD5STEP(F1, b, c, d, a, in[3] + 0xc1bdceee, 22);
	MD5STEP(F1, a, b, c, d, in[4] + 0xf57c0faf, 7);
	MD5STEP(F1, d, a, b, c, in[5] + 0x4787c62a, 12);
	MD5STEP(F1, c, d, a, b, in[6] + 0xa8304613, 17);
	MD5STEP(F1, b, c, d, a, in[7] + 0xfd469501, 22);
	MD5STEP(F1, a, b, c, d, in[8] + 0x698098d8, 7);
	MD5STEP(F1, d, a, b, c, in[9] + 0x8b44f7af, 12);
	MD5STEP(F1, c, d, a, b, in[10] + 0xffff5bb1, 17);
	MD5STEP(F1, b, c, d, a, in[11] + 0x895cd7be, 22);
	MD5STEP(F1, a, b, c, d, in[12] + 0x6b901122, 7);
	MD5STEP(F1, d, a, b, c, in[13] + 0xfd987193, 12);
	MD5STEP(F1, c, d, a, b, in[14] + 0xa679438e, 17);
	MD5STEP(F1, b, c, d, a, in[15] + 0x49b40821, 22);

	MD5STEP(F2, a, b, c, d, in[1] + 0xf61e2562, 5);
	MD5STEP(F2, d, a, b, c, in[6] + 0xc040b340, 9);
	MD5STEP(F2, c, d, a, b, in[11] + 0x265e5a51, 14);
	MD5STEP(F2, b, c, d, a, in[0] + 0xe9b6c7aa, 20);
	MD5STEP(F2, a, b, c, d, in[5] + 0xd62f105d, 5);
	MD5STEP(F2, d, a, b, c, in[10] + 0x02441453, 9);
	MD5STEP(F2, c, d, a, b, in[15] + 0xd8a1e681, 14);
	MD5STEP(F2, b, c, d, a, in[4] + 0xe7d3fbc8, 20);
	MD5STEP(F2, a, b, c, d, in[9] + 0x21e1cde6, 5);
	MD5STEP(F2, d, a, b, c, in[14] + 0xc33707d6, 9);
	MD5STEP(F2, c, d, a, b, in[3] + 0xf4d50d87, 14);
	MD5STEP(F2, b, c, d, a, in[8] + 0x455a14ed, 20);
	MD5STEP(F2, a, b, c, d, in[13] + 0xa9e3e905, 5);
	MD5STEP(F2, d, a, b, c, in[2] + 0xfcefa3f8, 9);
	MD5STEP(F2, c, d, a, b, in[7] + 0x676f02d9, 14);
	MD5STEP(F2, b, c, d, a, in[12] + 0x8d2a4c8a, 20);

	MD5STEP(F3, a, b, c, d, in[5] + 0xfffa3942, 4);
	MD5STEP(F3, d, a, b, c, in[8] + 0x8771f681, 11);
	MD5STEP(F3, c, d, a, b, in[11] + 0x6d9d6122, 16);
	MD5STEP(F3, b, c, d, a, in[14] + 0xfde5380c, 23);
	MD5STEP(F3, a, b, c, d, in[1] + 0xa4beea44, 4);
	MD5STEP(F3, d, a, b, c, in[4] + 0x4bdecfa9, 11);
	MD5STEP(F3, c, d, a, b, in[7] + 0xf6bb4b60, 16);
	MD5STEP(F3, b, c, d, a, in[10] + 0xbebfbc70, 23);
	MD5STEP(F3, a, b, c, d, in[13] + 0x289b7ec6, 4);
	MD5STEP(F3, d, a, b, c, in[0] + 0xeaa127fa, 11);
	MD5STEP(F3, c, d, a, b, in[3] + 0xd4ef3085, 16);
	MD5STEP(F3, b, c, d, a, in[6] + 0x04881d05, 23);
	MD5STEP(F3, a, b, c, d, in[9] + 0xd9d4d039, 4);
	MD5STEP(F3, d, a, b, c, in[12] + 0xe6db99e5, 11);
	MD5STEP(F3, c, d, a, b, in[15] + 0x1fa27cf8, 16);
	MD5STEP(F3, b, c, d, a, in[2] + 0xc4ac5665, 23);

	MD5STEP(F4, a, b, c, d, in[0] + 0xf4292244, 6);
	MD5STEP(F4, d, a, b, c, in[7] + 0x432aff97, 10);
	MD5STEP(F4, c, d, a, b, in[14] + 0xab9423a7, 15);
	MD5STEP(F4, b, c, d, a, in[5] + 0xfc93a039, 21);
	MD5STEP(F4, a, b, c, d, in[12] + 0x655b59c3, 6);
	MD5STEP(F4, d, a, b, c, in[3] + 0x8f0ccc92, 10);
	MD5STEP(F4, c, d, a, b, in[10] + 0xffeff47d, 15);
	MD5STEP(F4, b, c, d, a, in[1] + 0x85845dd1, 21);
	MD5STEP(F4, a, b, c, d, in[8] + 0x6fa87e4f, 6);
	MD5STEP(F4, d, a, b, c, in[15] + 0xfe2ce6e0, 10);
	MD5STEP(F4, c, d, a, b, in[6] + 0xa3014314, 15);
	MD5STEP(F4, b, c, d, a, in[13] + 0x4e0811a1, 21);
	MD5STEP(F4, a, b, c, d, in[4] + 0xf7537e82, 6);
	MD5STEP(F4, d, a, b, c, in[11] + 0xbd3af235, 10);
	MD5STEP(F4, c, d, a, b, in[2] + 0x2ad7d2bb, 15);
	MD5STEP(F4, b, c, d, a, in[9] + 0xeb86d391, 21);

	buf[0] += a;
	buf[1] += b;
	buf[2] += c;
	buf[3] += d;
}